

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findfunction.cpp
# Opt level: O1

void comparator(string *gtn,string *ltn,string *eqt,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *b,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *c,int i)

{
  long lVar1;
  pointer pbVar2;
  pointer pcVar3;
  string *psVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  lVar7 = (long)i;
  lVar1 = lVar7 + 2;
  iVar6 = std::__cxx11::string::compare
                    ((char *)((b->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar1));
  psVar4 = eqt;
  if (iVar6 == 0) {
    std::__cxx11::string::_M_assign((string *)gtn);
    lVar1 = lVar7 + 1;
    pbVar2 = (b->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    pcVar3 = pbVar2[lVar1]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d0,pcVar3,pcVar3 + pbVar2[lVar1]._M_string_length);
    lVar7 = lVar7 + 3;
    pbVar2 = (b->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    pcVar3 = pbVar2[lVar7]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,pcVar3,pcVar3 + pbVar2[lVar7]._M_string_length);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"<","");
    bVar5 = searchcomp(&local_1d0,&local_1f0,i,b,&local_50,ltn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if (bVar5) {
      searchwire(c,ltn,gtn);
    }
    pbVar2 = (b->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = pbVar2[lVar1]._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + pbVar2[lVar1]._M_string_length);
    pbVar2 = (b->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = pbVar2[lVar7]._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + pbVar2[lVar7]._M_string_length);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"==","");
    bVar5 = searchcomp(&local_70,&local_90,i,b,&local_b0,eqt);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  else {
    iVar6 = std::__cxx11::string::compare
                      ((char *)((b->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + lVar1));
    if (iVar6 == 0) {
      std::__cxx11::string::_M_assign((string *)ltn);
      lVar1 = lVar7 + 1;
      pbVar2 = (b->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      pcVar3 = pbVar2[lVar1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar3,pcVar3 + pbVar2[lVar1]._M_string_length);
      lVar7 = lVar7 + 3;
      pbVar2 = (b->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      pcVar3 = pbVar2[lVar7]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,pcVar3,pcVar3 + pbVar2[lVar7]._M_string_length);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,">","");
      bVar5 = searchcomp(&local_210,&local_230,i,b,&local_d0,gtn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if (bVar5) {
        searchwire(c,gtn,ltn);
      }
      pbVar2 = (b->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = pbVar2[lVar1]._M_dataplus._M_p;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar3,pcVar3 + pbVar2[lVar1]._M_string_length);
      pbVar2 = (b->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = pbVar2[lVar7]._M_dataplus._M_p;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar3,pcVar3 + pbVar2[lVar7]._M_string_length);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"==","");
      bVar5 = searchcomp(&local_f0,&local_110,i,b,&local_130,eqt);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      gtn = ltn;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
    }
    else {
      iVar6 = std::__cxx11::string::compare
                        ((char *)((b->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + lVar1));
      if (iVar6 != 0) {
        return;
      }
      std::__cxx11::string::_M_assign((string *)eqt);
      lVar1 = lVar7 + 1;
      pbVar2 = (b->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      pcVar3 = pbVar2[lVar1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,pcVar3,pcVar3 + pbVar2[lVar1]._M_string_length);
      lVar7 = lVar7 + 3;
      pbVar2 = (b->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      pcVar3 = pbVar2[lVar7]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,pcVar3,pcVar3 + pbVar2[lVar7]._M_string_length);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,">","");
      bVar5 = searchcomp(&local_250,&local_270,i,b,&local_150,gtn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      if (bVar5) {
        searchwire(c,gtn,eqt);
      }
      pbVar2 = (b->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = pbVar2[lVar1]._M_dataplus._M_p;
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,pcVar3,pcVar3 + pbVar2[lVar1]._M_string_length);
      pbVar2 = (b->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pcVar3 = pbVar2[lVar7]._M_dataplus._M_p;
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,pcVar3,pcVar3 + pbVar2[lVar7]._M_string_length);
      local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"<","");
      bVar5 = searchcomp(&local_170,&local_190,i,b,&local_1b0,ltn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      psVar4 = ltn;
      gtn = eqt;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
    }
  }
  if (bVar5) {
    searchwire(c,psVar4,gtn);
  }
  return;
}

Assistant:

void comparator(string *gtn, string *ltn, string *eqt, vector<string> & b, vector<string> & c,int i)
{
	
	if (b[i + 2] == ">")
	{
		*gtn = b[i - 1];
		if (searchcomp(b[i + 1], b[i + 3], i, b, "<", ltn))			// search for lesser than condition
			searchwire(c, ltn,gtn);
		if( searchcomp(b[i+1], b[i + 3], i, b, "==",eqt))			//search for equal to condition
			searchwire(c, eqt, gtn);
	}
	else if (b[i + 2] == "<")
	{
		*ltn = b[i - 1];
		if (searchcomp(b[i+1], b[i + 3], i, b, ">", gtn))			// search for greater than condition
			searchwire(c, gtn, ltn);
		if (searchcomp(b[i + 1], b[i + 3], i, b, "==", eqt))			//search for equal to condition
			searchwire(c, eqt, ltn);
	}
	else if (b[i + 2] == "==")
	{
		*eqt = b[i - 1];
		if (searchcomp(b[i + 1], b[i + 3], i, b, ">", gtn))			// search for greater than condition
			searchwire(c, gtn, eqt);
		if (searchcomp(b[i + 1], b[i + 3], i, b, "<", ltn))			// search for lesser than condition
			searchwire(c, ltn, eqt);
	}

}